

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O2

bool __thiscall TypeInfo::testInBuiltTypesOnAttributes(TypeInfo *this,bool DTDPresent)

{
  XStr XVar1;
  bool bVar2;
  DOMElement *pDVar3;
  long *plVar4;
  XMLCh *pXVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  wchar16 *pwVar9;
  long *plVar10;
  undefined1 uVar11;
  XStr local_40;
  XStr local_38;
  
  XStr::XStr(&local_40,"attrTest");
  pDVar3 = findElement(this,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x1d8))(pDVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_40,"attrTestType");
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,local_40.fUnicodeForm);
  if (bVar2) {
    plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x1d8))(pDVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_38,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
    XStr::~XStr(&local_38);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_40);
  uVar11 = tmp;
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa0);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_40,"attrTestType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_38,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x1d8))(pDVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x1d8))(pDVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x1d8))(pDVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x1d8))(pDVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  XStr::XStr(&local_40,"anySimpleType");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001036e0;
  }
  else {
    tmp = false;
LAB_001036e0:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa5);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"string");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001038ec;
  }
  else {
    tmp = false;
LAB_001038ec:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa8);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"boolean");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00103af8;
  }
  else {
    tmp = false;
LAB_00103af8:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xab);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"decimal");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00103d04;
  }
  else {
    tmp = false;
LAB_00103d04:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xae);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"float");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00103f10;
  }
  else {
    tmp = false;
LAB_00103f10:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb1);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"double");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_0010411c;
  }
  else {
    tmp = false;
LAB_0010411c:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb4);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"duration");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION)
  ;
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00104328;
  }
  else {
    tmp = false;
LAB_00104328:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb7);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"dateTime");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME)
  ;
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00104534;
  }
  else {
    tmp = false;
LAB_00104534:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xba);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"time");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TIME);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00104740;
  }
  else {
    tmp = false;
LAB_00104740:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xbd);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TIME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"date");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_0010494c;
  }
  else {
    tmp = false;
LAB_0010494c:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc0);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"gYearMonth");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00104b58;
  }
  else {
    tmp = false;
LAB_00104b58:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc3);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"gYear");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00104d64;
  }
  else {
    tmp = false;
LAB_00104d64:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc6);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"gMonthDay");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY)
  ;
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00104f70;
  }
  else {
    tmp = false;
LAB_00104f70:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc9);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"gDay");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_0010517c;
  }
  else {
    tmp = false;
LAB_0010517c:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xcc);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DAY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"gMonth");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00105388;
  }
  else {
    tmp = false;
LAB_00105388:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xcf);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"hexBinary");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00105594;
  }
  else {
    tmp = false;
LAB_00105594:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd2);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"base64Binary");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001057a0;
  }
  else {
    tmp = false;
LAB_001057a0:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd5);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"anyURI");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001059ac;
  }
  else {
    tmp = false;
LAB_001059ac:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd8);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"QName");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00105bb8;
  }
  else {
    tmp = false;
LAB_00105bb8:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xdb);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"normalizedString");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00105dc4;
  }
  else {
    tmp = false;
LAB_00105dc4:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xde);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"token");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00105fd0;
  }
  else {
    tmp = false;
LAB_00105fd0:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe1);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"language");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE)
  ;
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001061dc;
  }
  else {
    tmp = false;
LAB_001061dc:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe4);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"NMTOKEN");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokenString);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001063e8;
  }
  else {
    tmp = false;
LAB_001063e8:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe7);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokenString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"NMTOKENS");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001065f4;
  }
  else {
    tmp = false;
LAB_001065f4:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xea);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokensString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"Name");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NAME);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00106800;
  }
  else {
    tmp = false;
LAB_00106800:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xed);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"NCName");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00106a0c;
  }
  else {
    tmp = false;
LAB_00106a0c:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf0);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"ID");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::XMLUni::fgIDString);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00106c18;
  }
  else {
    tmp = false;
LAB_00106c18:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf3);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"IDREF");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::XMLUni::fgIDRefString);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00106e24;
  }
  else {
    tmp = false;
LAB_00106e24:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf6);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"IDREFS");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::XMLUni::fgIDRefsString);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00107030;
  }
  else {
    tmp = false;
LAB_00107030:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf9);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefsString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  if (DTDPresent) {
    XStr::XStr(&local_40,"ENTITY");
    plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
    XStr::~XStr(&local_40);
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
    bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::XMLUni::fgEntityString);
    if (bVar2) {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
      tmp = xercesc_4_0::XMLString::equals
                      (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      if (!tmp) goto LAB_00107245;
    }
    else {
      tmp = false;
LAB_00107245:
      poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xfe);
      poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 ((wchar16 *)&xercesc_4_0::XMLUni::fgEntityString,
                                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6,"\', uri \'");
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<(poVar6,pcVar7);
      std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
      if (lVar8 == 0) {
        pcVar7 = "(null)";
      }
      else {
        plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
        pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
        pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      std::operator<<((ostream *)&std::cerr,pcVar7);
      std::operator<<((ostream *)&std::cerr,"\', uri \'");
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
      if (lVar8 == 0) {
        pcVar7 = "(null)";
      }
      else {
        plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
        pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
        pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      std::operator<<((ostream *)&std::cerr,pcVar7);
      poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar11 = 0;
    }
    XStr::XStr(&local_40,"ENTITIES");
    plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
    XStr::~XStr(&local_40);
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
    bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::XMLUni::fgEntitiesString);
    if (bVar2) {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
      tmp = xercesc_4_0::XMLString::equals
                      (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      if (tmp) goto LAB_001075c9;
    }
    else {
      tmp = false;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x101);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgEntitiesString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
LAB_001075c9:
  XStr::XStr(&local_40,"integer");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_0010765d;
  }
  else {
    tmp = false;
LAB_0010765d:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x105);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"nonPositiveInteger");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00107869;
  }
  else {
    tmp = false;
LAB_00107869:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x108);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"negativeInteger");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00107a75;
  }
  else {
    tmp = false;
LAB_00107a75:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10b);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"long");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LONG);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00107c81;
  }
  else {
    tmp = false;
LAB_00107c81:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10e);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LONG,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"int");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00107e8d;
  }
  else {
    tmp = false;
LAB_00107e8d:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x111);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"short");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00108099;
  }
  else {
    tmp = false;
LAB_00108099:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x114);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"byte");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001082a5;
  }
  else {
    tmp = false;
LAB_001082a5:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x117);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"nonNegativeInteger");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001084b1;
  }
  else {
    tmp = false;
LAB_001084b1:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11a);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"unsignedLong");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001086bd;
  }
  else {
    tmp = false;
LAB_001086bd:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11d);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"unsignedInt");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001088c9;
  }
  else {
    tmp = false;
LAB_001088c9:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x120);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UINT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"unsignedShort");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00108ad5;
  }
  else {
    tmp = false;
LAB_00108ad5:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x123);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"unsignedByte");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00108ce1;
  }
  else {
    tmp = false;
LAB_00108ce1:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x126);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"positiveInteger");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00108eed;
  }
  else {
    tmp = false;
LAB_00108eed:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x129);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"defaultString");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_001090f9;
  }
  else {
    tmp = false;
LAB_001090f9:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x12d);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"defaultInt");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (!tmp) goto LAB_00109305;
  }
  else {
    tmp = false;
LAB_00109305:
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x130);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_40,"http://www.w3.org/2000/xmlns/");
  XVar1.fUnicodeForm = local_40.fUnicodeForm;
  XStr::XStr(&local_38,"prefix");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))
                             (pDVar3,XVar1.fUnicodeForm,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (tmp) goto LAB_001096aa;
  }
  else {
    tmp = false;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x134);
  poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
  pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                             ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                              xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  poVar6 = std::operator<<(poVar6,pcVar7);
  poVar6 = std::operator<<(poVar6,"\', uri \'");
  pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                             ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                              xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  std::operator<<(poVar6,pcVar7);
  std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
  if (lVar8 == 0) {
    pcVar7 = "(null)";
  }
  else {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  std::operator<<((ostream *)&std::cerr,"\', uri \'");
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
  if (lVar8 == 0) {
    pcVar7 = "(null)";
  }
  else {
    plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar11 = 0;
LAB_001096aa:
  XStr::XStr(&local_40,"http://www.w3.org/2001/XMLSchema-instance");
  XStr::XStr(&local_38,"noNamespaceSchemaLocation");
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))
                             (pDVar3,local_40.fUnicodeForm,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  XStr::~XStr(&local_40);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  bVar2 = xercesc_4_0::XMLString::equals(pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI);
  if (bVar2) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (tmp) {
      return (bool)uVar11;
    }
  }
  else {
    tmp = false;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x137);
  poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
  pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                             ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                              xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  poVar6 = std::operator<<(poVar6,pcVar7);
  poVar6 = std::operator<<(poVar6,"\', uri \'");
  pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                             ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                              xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  std::operator<<(poVar6,pcVar7);
  std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
  if (lVar8 == 0) {
    pcVar7 = "(null)";
  }
  else {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  std::operator<<((ostream *)&std::cerr,"\', uri \'");
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
  if (lVar8 == 0) {
    pcVar7 = "(null)";
  }
  else {
    plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
  std::endl<char,std::char_traits<char>>(poVar6);
  return false;
}

Assistant:

bool TypeInfo::testInBuiltTypesOnAttributes(bool DTDPresent) {

    bool passed = true;
    DOMElement *testEle = findElement(X("attrTest"));

    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrTestType"), X(""), __LINE__);

    DOMAttr *testAttr;

    testAttr = testEle->getAttributeNodeNS(0, X("anySimpleType"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYSIMPLETYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("string"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("boolean"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BOOLEAN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("decimal"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DECIMAL, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("float"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_FLOAT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("double"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DOUBLE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("duration"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DURATION, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("dateTime"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DATETIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("time"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_TIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("date"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DATE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gYearMonth"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_YEARMONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gYear"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_YEAR, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gMonthDay"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_MONTHDAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gDay"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gMonth"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_MONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("hexBinary"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_HEXBINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("base64Binary"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BASE64BINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("anyURI"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("QName"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_QNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("normalizedString"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NORMALIZEDSTRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("token"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_TOKEN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("language"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_LANGUAGE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NMTOKEN"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgNmTokenString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NMTOKENS"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgNmTokensString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("Name"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NCName"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NCNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("ID"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("IDREF"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDRefString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("IDREFS"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDRefsString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);


    if(DTDPresent) {
        testAttr = testEle->getAttributeNodeNS(0, X("ENTITY"));
        DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgEntityString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

        testAttr = testEle->getAttributeNodeNS(0, X("ENTITIES"));
        DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgEntitiesString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    }

    testAttr = testEle->getAttributeNodeNS(0, X("integer"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("nonPositiveInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NONPOSITIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("negativeInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NEGATIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("long"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_LONG, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("int"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("short"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_SHORT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("byte"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BYTE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("nonNegativeInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NONNEGATIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedLong"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ULONG, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedInt"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_UINT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedShort"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_USHORT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedByte"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_UBYTE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("positiveInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_POSITIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    //couple of defaulted ones
    testAttr = testEle->getAttributeNodeNS(0, X("defaultString"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("defaultInt"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    //ns attr
    testAttr = testEle->getAttributeNodeNS(X("http://www.w3.org/2000/xmlns/"), X("prefix"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(X("http://www.w3.org/2001/XMLSchema-instance"), X("noNamespaceSchemaLocation"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    return passed;
}